

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O3

int property_get(char *key,char *value,char *default_value)

{
  size_t sVar1;
  ssize_t sVar2;
  char sendBuf [33];
  char recvBuf [93];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98;
  char local_88;
  char local_87 [103];
  
  pthread_once(&gInitOnce,init);
  if (gPropFd < 0) {
    if (default_value == (char *)0x0) {
      return -1;
    }
  }
  else {
    sVar1 = strlen(key);
    if (0x1f < sVar1) {
      return -1;
    }
    uStack_b0 = 0xdddddddddddddddd;
    local_a8 = 0xdddddddddddddddd;
    uStack_a0 = 0xdddddddddddddddd;
    local_98 = 0xdd;
    local_b8 = 0xdddddddddddddd01;
    strcpy((char *)((long)&local_b8 + 1),key);
    pthread_mutex_lock((pthread_mutex_t *)&gPropertyFdLock);
    sVar2 = write(gPropFd,&local_b8,0x21);
    if (sVar2 != 0x21) {
      pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
      return -1;
    }
    sVar2 = read(gPropFd,&local_88,0x5d);
    pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
    if (sVar2 != 0x5d) {
      return -1;
    }
    if (local_88 == '\x01') {
      default_value = local_87;
    }
    else {
      if (local_88 != '\0') {
        printf("Got strange response to property_get request (%d)\n",(ulong)(uint)(int)local_88);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kiddlu[P]android-init-for-linux/libprop/properties.c"
                      ,0x94,"int property_get(const char *, char *, const char *)");
      }
      if (default_value == (char *)0x0) {
        *value = '\0';
        return 0;
      }
    }
  }
  strcpy(value,default_value);
  sVar1 = strlen(value);
  return (int)sVar1;
}

Assistant:

int property_get(const char *key, char *value, const char *default_value)
{
    char sendBuf[1+PROPERTY_KEY_MAX];
    char recvBuf[1+PROPERTY_VALUE_MAX];
    int len = -1;

    //LOGV("PROPERTY GET [%s]\n", key);

    pthread_once(&gInitOnce, init);
    if (gPropFd < 0) {
        /* this mimics the behavior of the device implementation */
        if (default_value != NULL) {
            strcpy(value, default_value);
            len = strlen(value);
        }
        return len;
    }

    if (strlen(key) >= PROPERTY_KEY_MAX) return -1;

    memset(sendBuf, 0xdd, sizeof(sendBuf));    // placate valgrind

    sendBuf[0] = (char) kSystemPropertyGet;
    strcpy(sendBuf+1, key);

    pthread_mutex_lock(&gPropertyFdLock);
    if (write(gPropFd, sendBuf, sizeof(sendBuf)) != sizeof(sendBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    if (read(gPropFd, recvBuf, sizeof(recvBuf)) != sizeof(recvBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    pthread_mutex_unlock(&gPropertyFdLock);

    /* first byte is 0 if value not defined, 1 if found */
    if (recvBuf[0] == 0) {
        if (default_value != NULL) {
            strcpy(value, default_value);
            len = strlen(value);
        } else {
            /*
             * If the value isn't defined, hand back an empty string and
             * a zero length, rather than a failure.  This seems wrong,
             * since you can't tell the difference between "undefined" and
             * "defined but empty", but it's what the device does.
             */
            value[0] = '\0';
            len = 0;
        }
    } else if (recvBuf[0] == 1) {
        strcpy(value, recvBuf+1);
        len = strlen(value);
    } else {
        printf("Got strange response to property_get request (%d)\n",
            recvBuf[0]);
        assert(0);
        return -1;
    }
    //LOGV("PROP [found=%d def='%s'] (%d) [%s]: [%s]\n",
    //    recvBuf[0], default_value, len, key, value);

    return len;
}